

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::loop(EventLoop *this)

{
  bool bVar1;
  LogLevel LVar2;
  uint uVar3;
  LogStream *pLVar4;
  self *psVar5;
  Timestamp TVar6;
  pointer pTVar7;
  pointer pPVar8;
  reference ppCVar9;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_2020 [12];
  Logger local_2010;
  int64_t local_1040;
  Channel *local_1038;
  Channel *channel;
  iterator __end3;
  iterator __begin3;
  ChannelList *__range3;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  EventLoop *local_10;
  EventLoop *this_local;
  
  local_10 = this;
  if (((this->m_looping ^ 0xffU) & 1) != 0) {
    assertInLoopThread(this);
    this->m_looping = true;
    std::atomic<bool>::operator=(&this->m_quit,false);
    LVar2 = Logger::logLevel();
    if ((int)LVar2 < 1) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_ff0,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_ff0._0_8_;
      file.m_size = local_ff0._8_4_;
      Logger::Logger(&local_fe0,file,0x5d,TRACE,"loop");
      pLVar4 = Logger::stream(&local_fe0);
      psVar5 = LogStream::operator<<(pLVar4,"EventLoop ");
      pLVar4 = LogStream::operator<<(psVar5,this);
      LogStream::operator<<(pLVar4," start looping");
      Logger::~Logger(&local_fe0);
    }
    while (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_quit),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::clear
                (&this->m_activeChannels);
      TVar6 = Timestamp::now();
      (this->m_pollTime).m_microSecondsSinceEpoch = TVar6.m_microSecondsSinceEpoch;
      pTVar7 = std::unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>::
               operator->(&this->m_timerQueue);
      TimerQueue::expiredProcess(pTVar7,(Timestamp)(this->m_pollTime).m_microSecondsSinceEpoch);
      pPVar8 = std::unique_ptr<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>::
               operator->(&this->m_poller);
      pTVar7 = std::unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>::
               operator->(&this->m_timerQueue);
      uVar3 = TimerQueue::earliestExpiredTime
                        (pTVar7,(Timestamp)(this->m_pollTime).m_microSecondsSinceEpoch,10000);
      (*pPVar8->_vptr_Poller[2])(pPVar8,&this->m_activeChannels,(ulong)uVar3);
      this->m_iteration = this->m_iteration + 1;
      LVar2 = Logger::logLevel();
      if ((int)LVar2 < 1) {
        printActiveChannels(this);
      }
      this->m_eventHandling = true;
      __end3 = std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::begin
                         (&this->m_activeChannels);
      channel = (Channel *)
                std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::end
                          (&this->m_activeChannels);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
                                         *)&channel), bVar1) {
        ppCVar9 = __gnu_cxx::
                  __normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
                  ::operator*(&__end3);
        local_1038 = *ppCVar9;
        this->m_currentActiveChannel = local_1038;
        local_1040 = (this->m_pollTime).m_microSecondsSinceEpoch;
        Channel::handleEvent(this->m_currentActiveChannel,(Timestamp)local_1040);
        __gnu_cxx::
        __normal_iterator<sznet::net::Channel_**,_std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>_>
        ::operator++(&__end3);
      }
      this->m_currentActiveChannel = (Channel *)0x0;
      this->m_eventHandling = false;
      doPendingFunctors(this);
    }
    LVar2 = Logger::logLevel();
    if ((int)LVar2 < 1) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_2020,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_2020._0_8_;
      file_00.m_size = local_2020._8_4_;
      Logger::Logger(&local_2010,file_00,0x7b,TRACE,"loop");
      pLVar4 = Logger::stream(&local_2010);
      psVar5 = LogStream::operator<<(pLVar4,"EventLoop ");
      pLVar4 = LogStream::operator<<(psVar5,this);
      LogStream::operator<<(pLVar4," stop looping");
      Logger::~Logger(&local_2010);
    }
    this->m_looping = false;
    return;
  }
  __assert_fail("!m_looping",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0x59,"void sznet::net::EventLoop::loop()");
}

Assistant:

void EventLoop::loop()
{
	assert(!m_looping);
	assertInLoopThread();
	m_looping = true;
	m_quit = false;
	LOG_TRACE << "EventLoop " << this << " start looping";

	while (!m_quit)
	{
		m_activeChannels.clear();
		m_pollTime = Timestamp::now();
		// 优先处理到期timer
		m_timerQueue->expiredProcess(m_pollTime);
		// IO
		m_poller->poll(&m_activeChannels, m_timerQueue->earliestExpiredTime(m_pollTime, kPollTimeMs));
		++m_iteration;
		if (Logger::logLevel() <= Logger::TRACE)
		{
			printActiveChannels();
		}
		m_eventHandling = true;
		// 处理就绪事件
		for (Channel* channel : m_activeChannels)
		{
			m_currentActiveChannel = channel;
			m_currentActiveChannel->handleEvent(m_pollTime);
		}
		m_currentActiveChannel = nullptr;
		m_eventHandling = false;
		// 执行m_pendingFunctors中的任务回调
		// 这种设计使得IO线程也能执行一些计算任务，避免了IO线程在不忙时长期阻塞在IO multiplexing调用中
		// 这些任务显然必须是要求在IO线程中执行
		doPendingFunctors();
	}
	
	LOG_TRACE << "EventLoop " << this << " stop looping";
	m_looping = false;
}